

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_pdfa.c
# Opt level: O1

HPDF_STATUS HPDF_PDFA_GenerateID(HPDF_Doc pdf)

{
  HPDF_UINT len;
  HPDF_BYTE *buf;
  void *pvVar1;
  HPDF_Array array;
  HPDF_STATUS HVar2;
  HPDF_Binary p_Var3;
  HPDF_BYTE idkey [16];
  time_t ltime;
  HPDF_MD5_CTX md5_ctx;
  HPDF_BYTE aHStack_98 [24];
  time_t local_80;
  HPDF_MD5Context local_78;
  
  HVar2 = 0;
  local_80 = time((time_t *)0x0);
  buf = (HPDF_BYTE *)ctime(&local_80);
  pvVar1 = HPDF_Dict_GetItem(pdf->trailer,"ID",0x10);
  if (pvVar1 == (void *)0x0) {
    array = HPDF_Array_New(pdf->mmgr);
    if ((array != (HPDF_Array)0x0) && (HVar2 = HPDF_Dict_Add(pdf->trailer,"ID",array), HVar2 == 0))
    {
      HPDF_MD5Init(&local_78);
      HPDF_MD5Update(&local_78,(HPDF_BYTE *)"libHaru",7);
      len = HPDF_StrLen((char *)buf,-1);
      HPDF_MD5Update(&local_78,buf,len);
      HPDF_MD5Final(aHStack_98,&local_78);
      p_Var3 = HPDF_Binary_New(pdf->mmgr,aHStack_98,0x10);
      HVar2 = HPDF_Array_Add(array,p_Var3);
      if (HVar2 == 0) {
        p_Var3 = HPDF_Binary_New(pdf->mmgr,aHStack_98,0x10);
        HVar2 = HPDF_Array_Add(array,p_Var3);
        if (HVar2 == 0) {
          return 0;
        }
      }
    }
    HVar2 = (pdf->error).error_no;
  }
  return HVar2;
}

Assistant:

HPDF_STATUS
HPDF_PDFA_GenerateID(HPDF_Doc pdf)
{
    HPDF_Array id;
    HPDF_BYTE *currentTime;
    HPDF_BYTE idkey[HPDF_MD5_KEY_LEN];
    HPDF_MD5_CTX md5_ctx;
    time_t ltime;

    ltime = time(NULL);
    currentTime = (HPDF_BYTE *)ctime(&ltime);

    id = HPDF_Dict_GetItem(pdf->trailer, "ID", HPDF_OCLASS_ARRAY);
    if (!id) {
       id = HPDF_Array_New(pdf->mmgr);

       if (!id || HPDF_Dict_Add(pdf->trailer, "ID", id) != HPDF_OK)
         return pdf->error.error_no;

       HPDF_MD5Init(&md5_ctx);
       HPDF_MD5Update(&md5_ctx, (HPDF_BYTE *) "libHaru", sizeof("libHaru") - 1);
       HPDF_MD5Update(&md5_ctx, currentTime, HPDF_StrLen((const char *)currentTime, -1));
       HPDF_MD5Final(idkey, &md5_ctx);

       if (HPDF_Array_Add (id, HPDF_Binary_New (pdf->mmgr, idkey, HPDF_MD5_KEY_LEN)) != HPDF_OK)
         return pdf->error.error_no;

       if (HPDF_Array_Add (id, HPDF_Binary_New (pdf->mmgr,idkey,HPDF_MD5_KEY_LEN)) != HPDF_OK)
         return pdf->error.error_no;

       return HPDF_OK;
    }

    return HPDF_OK;
}